

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O0

int blake2b_final(blake2b_state *S,uint8_t *out,uint8_t outlen)

{
  byte in_DL;
  void *in_RSI;
  blake2b_state *in_RDI;
  uint8_t buffer [64];
  int i;
  uint8_t *in_stack_000000b8;
  blake2b_state *in_stack_000000c0;
  undefined1 auStack_58 [64];
  int local_18;
  byte local_11;
  void *local_10;
  blake2b_state *local_8;
  
  local_11 = in_DL;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (0x80 < in_RDI->buflen) {
    blake2b_increment_counter(in_RDI,0x80);
    blake2b_compress(in_stack_000000c0,in_stack_000000b8);
    local_8->buflen = local_8->buflen - 0x80;
    memcpy(local_8->buf,local_8->buf + 0x80,local_8->buflen);
  }
  blake2b_increment_counter(local_8,local_8->buflen);
  blake2b_set_lastblock((blake2b_state *)0x1ea31c);
  memset(local_8->buf + local_8->buflen,0,0x100 - local_8->buflen);
  blake2b_compress(in_stack_000000c0,in_stack_000000b8);
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    store64(auStack_58 + (long)local_18 * 8,local_8->h[local_18]);
  }
  memcpy(local_10,auStack_58,(ulong)local_11);
  return 0;
}

Assistant:

int blake2b_final( blake2b_state *S, uint8_t *out, uint8_t outlen )
{
    int i;
  uint8_t buffer[BLAKE2B_OUTBYTES];

  if( S->buflen > BLAKE2B_BLOCKBYTES )
  {
    blake2b_increment_counter( S, BLAKE2B_BLOCKBYTES );
    blake2b_compress( S, S->buf );
    S->buflen -= BLAKE2B_BLOCKBYTES;
    memcpy( S->buf, S->buf + BLAKE2B_BLOCKBYTES, S->buflen );
  }

  blake2b_increment_counter( S, S->buflen );
  blake2b_set_lastblock( S );
  memset( S->buf + S->buflen, 0, 2 * BLAKE2B_BLOCKBYTES - S->buflen ); /* Padding */
  blake2b_compress( S, S->buf );

  for( i = 0; i < 8; ++i ) /* Output full hash to temp buffer */
    store64( buffer + sizeof( S->h[i] ) * i, S->h[i] );

  memcpy( out, buffer, outlen );
  return 0;
}